

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.cpp
# Opt level: O0

bool __thiscall
Symbol::IsInSlot(Symbol *this,ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo,
                bool ensureSlotAlloc)

{
  bool bVar1;
  bool local_3a;
  bool local_39;
  bool ensureSlotAlloc_local;
  FuncInfo *funcInfo_local;
  ByteCodeGenerator *byteCodeGenerator_local;
  Symbol *this_local;
  
  bVar1 = GetIsGlobal(this);
  if ((bVar1) || (bVar1 = GetIsModuleExportStorage(this), bVar1)) {
    this_local._7_1_ = false;
  }
  else {
    bVar1 = FuncInfo::GetHasHeapArguments(funcInfo);
    if ((bVar1) &&
       ((bVar1 = GetIsFormal(this), bVar1 &&
        (bVar1 = ByteCodeGenerator::NeedScopeObjectForArguments
                           (byteCodeGenerator,funcInfo,funcInfo->root), bVar1)))) {
      this_local._7_1_ = true;
    }
    else {
      bVar1 = GetIsGlobalCatch(this);
      if (bVar1) {
        this_local._7_1_ = true;
      }
      else {
        bVar1 = Scope::GetCapturesAll(this->scope);
        if (bVar1) {
          this_local._7_1_ = true;
        }
        else {
          bVar1 = GetHasNonLocalReference(this);
          local_39 = false;
          if (bVar1) {
            local_3a = true;
            if (!ensureSlotAlloc) {
              local_3a = GetIsCommittedToSlot(this);
            }
            local_39 = local_3a;
          }
          this_local._7_1_ = local_39;
        }
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Symbol::IsInSlot(ByteCodeGenerator *byteCodeGenerator, FuncInfo *funcInfo, bool ensureSlotAlloc)
{
    if (this->GetIsGlobal() || this->GetIsModuleExportStorage())
    {
        return false;
    }
    if (funcInfo->GetHasHeapArguments() && this->GetIsFormal() && byteCodeGenerator->NeedScopeObjectForArguments(funcInfo, funcInfo->root))
    {
        return true;
    }
    if (this->GetIsGlobalCatch())
    {
        return true;
    }
    if (this->scope->GetCapturesAll())
    {
        return true;
    }

    return this->GetHasNonLocalReference() && (ensureSlotAlloc || this->GetIsCommittedToSlot());
}